

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexTools.c
# Opt level: O1

Abc_Cex_t * Bmc_CexInnerStates(Gia_Man_t *p,Abc_Cex_t *pCex,Abc_Cex_t **ppCexImpl,int fVerbose)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  int *piVar4;
  bool bVar5;
  int iVar6;
  Abc_Cex_t *pCex_00;
  Abc_Cex_t *pCex_01;
  ulong uVar7;
  int iVar8;
  long lVar9;
  Vec_Int_t *pVVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  uint local_5c;
  
  if (pCex->nRegs < 1) {
    __assert_fail("pCex->nRegs > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexTools.c"
                  ,0x18a,
                  "Abc_Cex_t *Bmc_CexInnerStates(Gia_Man_t *, Abc_Cex_t *, Abc_Cex_t **, int)");
  }
  iVar19 = 0;
  pCex_00 = Abc_CexAlloc(0,p->vCis->nSize,pCex->iFrame + 1);
  pCex_00->iFrame = pCex->iFrame;
  pCex_00->iPo = pCex->iPo;
  pCex_01 = Abc_CexAlloc(0,p->vCis->nSize,pCex->iFrame + 1);
  pCex_01->iFrame = pCex->iFrame;
  pCex_01->iPo = pCex->iPo;
  Gia_ManCleanMark01(p);
  *(ulong *)p->pObjs = *(ulong *)p->pObjs & 0xffffffffbfffffff;
  *(ulong *)p->pObjs = *(ulong *)p->pObjs | 0x4000000000000000;
  iVar8 = p->nRegs;
  if (0 < iVar8) {
    do {
      iVar6 = p->vCos->nSize;
      uVar14 = (iVar6 - iVar8) + iVar19;
      if (((int)uVar14 < 0) || (iVar6 <= (int)uVar14)) goto LAB_00504f4d;
      iVar8 = p->vCos->pArray[uVar14];
      lVar9 = (long)iVar8;
      if ((lVar9 < 0) || (p->nObjs <= iVar8)) goto LAB_00504f2e;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      *(ulong *)(pGVar3 + lVar9) =
           *(ulong *)(pGVar3 + lVar9) & 0xbfffffffbfffffff | 0x4000000000000000;
      iVar19 = iVar19 + 1;
      iVar8 = p->nRegs;
    } while (iVar19 < iVar8);
  }
  local_5c = pCex->nRegs;
  if (-1 < pCex->iFrame) {
    iVar8 = 0;
    do {
      pVVar10 = p->vCis;
      uVar12 = (ulong)(uint)pVVar10->nSize;
      if (p->nRegs < pVVar10->nSize) {
        lVar9 = 0;
        do {
          if ((int)uVar12 <= lVar9) goto LAB_00504f4d;
          lVar15 = (long)pVVar10->pArray[lVar9];
          if ((lVar15 < 0) || (p->nObjs <= pVVar10->pArray[lVar9])) goto LAB_00504f2e;
          pGVar3 = p->pObjs;
          if (pGVar3 == (Gia_Obj_t *)0x0) break;
          *(ulong *)(pGVar3 + lVar15) =
               *(ulong *)(pGVar3 + lVar15) & 0xffffffffbfffffff |
               (ulong)(((uint)(&pCex[1].iPo)[(int)((ulong)local_5c + lVar9) >> 5] >>
                        ((byte)((ulong)local_5c + lVar9) & 0x1f) & 1) << 0x1e);
          lVar9 = lVar9 + 1;
          pVVar10 = p->vCis;
          uVar12 = (ulong)pVVar10->nSize;
        } while (lVar9 < (long)(uVar12 - (long)p->nRegs));
        local_5c = local_5c + (int)lVar9;
      }
      iVar19 = p->nRegs;
      if (0 < iVar19) {
        iVar6 = 0;
        do {
          iVar1 = p->vCos->nSize;
          uVar14 = (iVar1 - iVar19) + iVar6;
          if (((int)uVar14 < 0) || (iVar1 <= (int)uVar14)) goto LAB_00504f4d;
          iVar1 = p->vCos->pArray[uVar14];
          if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_00504f2e;
          pGVar3 = p->pObjs;
          if (pGVar3 == (Gia_Obj_t *)0x0) break;
          iVar2 = p->vCis->nSize;
          uVar14 = (iVar2 - iVar19) + iVar6;
          if (((int)uVar14 < 0) || (iVar2 <= (int)uVar14)) goto LAB_00504f4d;
          iVar19 = p->vCis->pArray[uVar14];
          lVar9 = (long)iVar19;
          if ((lVar9 < 0) || (p->nObjs <= iVar19)) goto LAB_00504f2e;
          uVar7 = (ulong)((uint)*(ulong *)(pGVar3 + iVar1) & 0x40000000);
          uVar12 = *(ulong *)(pGVar3 + lVar9);
          *(ulong *)(pGVar3 + lVar9) = uVar12 & 0xffffffffbfffffff | uVar7;
          *(ulong *)(pGVar3 + lVar9) =
               uVar12 & 0xbfffffffbfffffff | uVar7 | *(ulong *)(pGVar3 + iVar1) & 0x4000000000000000
          ;
          iVar6 = iVar6 + 1;
          iVar19 = p->nRegs;
        } while (iVar6 < iVar19);
      }
      pVVar10 = p->vCis;
      if (0 < pVVar10->nSize) {
        piVar4 = pVVar10->pArray;
        lVar9 = 0;
        do {
          iVar19 = piVar4[lVar9];
          if (((long)iVar19 < 0) || (p->nObjs <= iVar19)) goto LAB_00504f2e;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar3 = p->pObjs + iVar19;
          if ((pGVar3->field_0x3 & 0x40) != 0) {
            iVar19 = pCex_00->nPis * iVar8 + (int)lVar9;
            (&pCex_00[1].iPo)[iVar19 >> 5] =
                 (&pCex_00[1].iPo)[iVar19 >> 5] | 1 << ((byte)iVar19 & 0x1f);
          }
          if (((undefined1  [12])*pGVar3 & (undefined1  [12])0x4000000000000000) !=
              (undefined1  [12])0x0) {
            iVar19 = pCex_01->nPis * iVar8 + (int)lVar9;
            (&pCex_01[1].iPo)[iVar19 >> 5] =
                 (&pCex_01[1].iPo)[iVar19 >> 5] | 1 << ((byte)iVar19 & 0x1f);
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < pVVar10->nSize);
      }
      if (0 < p->nObjs) {
        lVar9 = 0;
        lVar15 = 0;
        do {
          pGVar3 = p->pObjs;
          if (pGVar3 == (Gia_Obj_t *)0x0) break;
          uVar12 = *(ulong *)(&pGVar3->field_0x0 + lVar9);
          uVar14 = (uint)uVar12;
          if ((uVar12 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar14) {
            uVar11 = (uint)(uVar12 >> 0x1d) & 7 ^
                     *(uint *)((long)pGVar3 +
                              (ulong)(uint)((int)(uVar12 & 0x1fffffff) << 2) * -3 + lVar9) >> 0x1e;
            uVar17 = (uint)(uVar12 >> 0x1e);
            uVar13 = *(uint *)((long)pGVar3 + (ulong)(uVar17 & 0x7ffffffc) * -3 + lVar9) >> 0x1e & 1
            ;
            uVar20 = (uint)(uVar12 >> 0x3d) & 1;
            uVar18 = (uVar13 ^ uVar20) & uVar11;
            uVar7 = (ulong)(uVar18 << 0x1e);
            *(ulong *)(&pGVar3->field_0x0 + lVar9) = uVar12 & 0xffffffff3fffffff | uVar7;
            if (uVar18 == 0) {
              if (((uVar11 & 1) == 0) && (uVar13 == uVar20)) {
                uVar7 = *(ulong *)((long)pGVar3 + lVar9 + (ulong)(uVar17 & 0x7ffffffc) * -3) |
                        *(ulong *)((long)pGVar3 + lVar9 + (ulong)((uVar14 & 0x1fffffff) << 2) * -3);
              }
              else {
                if ((uVar11 & 1) != 0) {
                  if (uVar13 != uVar20) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexTools.c"
                                  ,0x1bc,
                                  "Abc_Cex_t *Bmc_CexInnerStates(Gia_Man_t *, Abc_Cex_t *, Abc_Cex_t **, int)"
                                 );
                  }
                  uVar12 = uVar12 & 0xbfffffff3fffffff |
                           *(ulong *)((long)pGVar3 + lVar9 + (ulong)(uVar17 & 0x7ffffffc) * -3) &
                           0x4000000000000000;
                  goto LAB_00504d97;
                }
                uVar7 = *(ulong *)((long)pGVar3 + lVar9 + (ulong)((uVar14 & 0x1fffffff) << 2) * -3);
              }
              uVar12 = uVar12 & 0xbfffffff3fffffff | uVar7 & 0x4000000000000000;
            }
            else {
              uVar12 = uVar12 & 0xbfffffff3fffffff | uVar7 |
                       *(ulong *)((long)pGVar3 + lVar9 + (ulong)((uVar14 & 0x1fffffff) << 2) * -3) &
                       0x4000000000000000 &
                       *(ulong *)((long)pGVar3 + lVar9 + (ulong)(uVar17 & 0x7ffffffc) * -3);
            }
LAB_00504d97:
            *(ulong *)(&pGVar3->field_0x0 + lVar9) = uVar12;
          }
          lVar15 = lVar15 + 1;
          lVar9 = lVar9 + 0xc;
        } while (lVar15 < p->nObjs);
      }
      pVVar10 = p->vCos;
      if (0 < pVVar10->nSize) {
        lVar9 = 0;
        do {
          iVar19 = pVVar10->pArray[lVar9];
          if (((long)iVar19 < 0) || (p->nObjs <= iVar19)) goto LAB_00504f2e;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar3 = p->pObjs + iVar19;
          uVar12 = *(ulong *)pGVar3;
          uVar7 = (ulong)((uint)uVar12 & 0x1fffffff);
          uVar16 = (ulong)(((uint)uVar12 * 2 ^ *(uint *)(pGVar3 + -uVar7)) & 0x40000000);
          *(ulong *)pGVar3 = uVar12 & 0xffffffffbfffffff | uVar16;
          *(ulong *)pGVar3 =
               uVar12 & 0xbfffffffbfffffff | uVar16 |
               *(ulong *)(pGVar3 + -uVar7) & 0x4000000000000000;
          lVar9 = lVar9 + 1;
          pVVar10 = p->vCos;
        } while (lVar9 < pVVar10->nSize);
      }
      bVar5 = iVar8 < pCex->iFrame;
      iVar8 = iVar8 + 1;
    } while (bVar5);
  }
  if (local_5c != pCex->nBits) {
    __assert_fail("iBit == pCex->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexTools.c"
                  ,0x1d2,
                  "Abc_Cex_t *Bmc_CexInnerStates(Gia_Man_t *, Abc_Cex_t *, Abc_Cex_t **, int)");
  }
  uVar14 = pCex->iPo;
  iVar8 = p->vCos->nSize;
  if (iVar8 - p->nRegs <= (int)uVar14) {
    __assert_fail("v < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x1a7,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
  }
  if ((-1 < (int)uVar14) && ((int)uVar14 < iVar8)) {
    iVar8 = p->vCos->pArray[uVar14];
    if ((-1 < (long)iVar8) && (iVar8 < p->nObjs)) {
      if ((p->pObjs[iVar8].field_0x3 & 0x40) == 0) {
        __assert_fail("Gia_ManPo(p, pCex->iPo)->fMark0 == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexTools.c"
                      ,0x1d3,
                      "Abc_Cex_t *Bmc_CexInnerStates(Gia_Man_t *, Abc_Cex_t *, Abc_Cex_t **, int)");
      }
      printf("Inner states: ");
      Bmc_CexPrint(pCex_00,p->vCis->nSize - p->nRegs,fVerbose);
      printf("Implications: ");
      Bmc_CexPrint(pCex_01,p->vCis->nSize - p->nRegs,fVerbose);
      if (ppCexImpl == (Abc_Cex_t **)0x0) {
        Abc_CexFree(pCex_01);
      }
      else {
        *ppCexImpl = pCex_01;
      }
      return pCex_00;
    }
LAB_00504f2e:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
LAB_00504f4d:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

Abc_Cex_t * Bmc_CexInnerStates( Gia_Man_t * p, Abc_Cex_t * pCex, Abc_Cex_t ** ppCexImpl, int fVerbose )
{
    Abc_Cex_t * pNew, * pNew2;
    Gia_Obj_t * pObj, * pObjRo, * pObjRi;
    int fCompl0, fCompl1;
    int i, k, iBit = 0;
    assert( pCex->nRegs > 0 );
    // start the counter-example
    pNew = Abc_CexAlloc( 0, Gia_ManCiNum(p), pCex->iFrame + 1 );
    pNew->iFrame = pCex->iFrame;
    pNew->iPo    = pCex->iPo;
    // start the counter-example
    pNew2 = Abc_CexAlloc( 0, Gia_ManCiNum(p), pCex->iFrame + 1 );
    pNew2->iFrame = pCex->iFrame;
    pNew2->iPo    = pCex->iPo;
    // set initial state
    Gia_ManCleanMark01(p);
    // set const0
    Gia_ManConst0(p)->fMark0 = 0;
    Gia_ManConst0(p)->fMark1 = 1;
    // set init state
    Gia_ManForEachRi( p, pObjRi, k )
    {
        pObjRi->fMark0 = 0;
        pObjRi->fMark1 = 1;
    }
    iBit = pCex->nRegs;
    for ( i = 0; i <= pCex->iFrame; i++ )
    {
        Gia_ManForEachPi( p, pObj, k )
            pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
        {
            pObjRo->fMark0 = pObjRi->fMark0;
            pObjRo->fMark1 = pObjRi->fMark1;
        }
        Gia_ManForEachCi( p, pObj, k )
        {
            if ( pObj->fMark0 )
                Abc_InfoSetBit( pNew->pData, pNew->nPis * i + k );
            if ( pObj->fMark1 )
                Abc_InfoSetBit( pNew2->pData, pNew2->nPis * i + k );
        }
        Gia_ManForEachAnd( p, pObj, k )
        {
            fCompl0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
            fCompl1 = Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj);
            pObj->fMark0 = fCompl0 & fCompl1;
            if ( pObj->fMark0 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1 & Gia_ObjFanin1(pObj)->fMark1;
            else if ( !fCompl0 && !fCompl1 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1 | Gia_ObjFanin1(pObj)->fMark1;
            else if ( !fCompl0 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1;
            else if ( !fCompl1 )
                pObj->fMark1 = Gia_ObjFanin1(pObj)->fMark1;
            else assert( 0 );
        }
        Gia_ManForEachCo( p, pObj, k )
        {
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
            pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1;
        }

/*
        // print input/state/output
        printf( "%3d : ", i );
        Gia_ManForEachPi( p, pObj, k )
            printf( "%d", pObj->fMark0 );
        printf( " " );
        Gia_ManForEachRo( p, pObj, k )
            printf( "%d", pObj->fMark0 );
        printf( " " );
        Gia_ManForEachPo( p, pObj, k )
            printf( "%d", pObj->fMark0 );
        printf( "\n" );
*/
    }
    assert( iBit == pCex->nBits );
    assert( Gia_ManPo(p, pCex->iPo)->fMark0 == 1 );

    printf( "Inner states: " );
    Bmc_CexPrint( pNew, Gia_ManPiNum(p), fVerbose );
    printf( "Implications: " );
    Bmc_CexPrint( pNew2, Gia_ManPiNum(p), fVerbose );
    if ( ppCexImpl )
        *ppCexImpl = pNew2;
    else
        Abc_CexFree( pNew2 );
    return pNew;
}